

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

bool SaveError(char **errptr,Status *s)

{
  bool bVar1;
  char *pcVar2;
  Status local_60 [4];
  Status local_40 [4];
  Status *local_20;
  Status *s_local;
  char **errptr_local;
  
  local_20 = s;
  s_local = (Status *)errptr;
  if (errptr != (char **)0x0) {
    bVar1 = leveldb::Status::ok(s);
    if (bVar1) {
      errptr_local._7_1_ = false;
    }
    else {
      if (s_local->state_ == (char *)0x0) {
        leveldb::Status::ToString_abi_cxx11_(local_40);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        pcVar2 = strdup(pcVar2);
        s_local->state_ = pcVar2;
        std::__cxx11::string::~string((string *)local_40);
      }
      else {
        free(s_local->state_);
        leveldb::Status::ToString_abi_cxx11_(local_60);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        pcVar2 = strdup(pcVar2);
        s_local->state_ = pcVar2;
        std::__cxx11::string::~string((string *)local_60);
      }
      errptr_local._7_1_ = true;
    }
    return errptr_local._7_1_;
  }
  __assert_fail("errptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/c.cc"
                ,0x92,"bool SaveError(char **, const Status &)");
}

Assistant:

static bool SaveError(char** errptr, const Status& s) {
  assert(errptr != nullptr);
  if (s.ok()) {
    return false;
  } else if (*errptr == nullptr) {
    *errptr = strdup(s.ToString().c_str());
  } else {
    // TODO(sanjay): Merge with existing error?
    free(*errptr);
    *errptr = strdup(s.ToString().c_str());
  }
  return true;
}